

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_setup_motion_field(AV1_COMMON *cm)

{
  SequenceHeader *pSVar1;
  TPL_MV_REF *pTVar2;
  int ref_idx;
  int iVar3;
  long lVar4;
  uint uVar5;
  RefCntBuffer *pRVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int ref_order_hint [7];
  RefCntBuffer *ref_buf [7];
  uint local_88 [8];
  long local_68 [8];
  
  pSVar1 = cm->seq_params;
  if ((pSVar1->order_hint_info).enable_order_hint == 0) {
    return;
  }
  uVar5 = ((cm->mi_params).mi_stride >> 1) * ((cm->mi_params).mi_rows + 0x20 >> 1);
  if (0 < (int)uVar5) {
    pTVar2 = cm->tpl_mvs;
    uVar8 = 0;
    do {
      pTVar2[uVar8].mfmv0.as_int = 0x80008000;
      pTVar2[uVar8].ref_frame_offset = '\0';
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  uVar5 = cm->cur_frame->order_hint;
  lVar4 = 0;
  do {
    if (((long)cm->remapped_ref_idx[lVar4] == -1) ||
       (pRVar6 = cm->ref_frame_map[cm->remapped_ref_idx[lVar4]], pRVar6 == (RefCntBuffer *)0x0)) {
      pRVar6 = (RefCntBuffer *)0x0;
      uVar7 = 0;
    }
    else {
      uVar7 = pRVar6->order_hint;
    }
    local_68[lVar4] = (long)pRVar6;
    local_88[lVar4] = uVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  if (local_68[0] == 0) {
    iVar9 = 2;
  }
  else {
    iVar9 = 1;
    if (*(int *)(local_68[0] + 0x20) != local_88[3]) {
      motion_field_projection(cm,'\x01',2);
    }
  }
  if ((pSVar1->order_hint_info).enable_order_hint == 0) goto LAB_0039e21f;
  uVar7 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
  if ((int)(uVar7 & local_88[4] - uVar5) < (int)(uVar7 - 1 & local_88[4] - uVar5)) {
    iVar3 = motion_field_projection(cm,'\x05',0);
    if ((pSVar1->order_hint_info).enable_order_hint == 0) goto LAB_0039e21f;
    iVar9 = iVar9 - iVar3;
  }
  uVar7 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
  if ((int)(uVar7 & local_88[5] - uVar5) < (int)(uVar7 - 1 & local_88[5] - uVar5)) {
    iVar3 = motion_field_projection(cm,'\x06',0);
    iVar9 = iVar9 - iVar3;
    if ((pSVar1->order_hint_info).enable_order_hint != 0) goto LAB_0039e1e3;
  }
  else {
LAB_0039e1e3:
    uVar7 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    if (((int)(uVar7 & local_88[6] - uVar5) < (int)(uVar7 - 1 & local_88[6] - uVar5)) &&
       (-1 < iVar9)) {
      iVar3 = motion_field_projection(cm,'\a',0);
      if (iVar3 == 0) goto LAB_0039e21f;
      iVar9 = iVar9 + -1;
    }
  }
  if (iVar9 < 0) {
    return;
  }
LAB_0039e21f:
  motion_field_projection(cm,'\x02',2);
  return;
}

Assistant:

void av1_setup_motion_field(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  if (!order_hint_info->enable_order_hint) return;

  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int size = ((cm->mi_params.mi_rows + MAX_MIB_SIZE) >> 1) *
             (cm->mi_params.mi_stride >> 1);
  for (int idx = 0; idx < size; ++idx) {
    tpl_mvs_base[idx].mfmv0.as_int = INVALID_MV;
    tpl_mvs_base[idx].ref_frame_offset = 0;
  }

  const int cur_order_hint = cm->cur_frame->order_hint;
  const RefCntBuffer *ref_buf[INTER_REFS_PER_FRAME];
  int ref_order_hint[INTER_REFS_PER_FRAME];

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const int ref_idx = ref_frame - LAST_FRAME;
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    ref_buf[ref_idx] = buf;
    ref_order_hint[ref_idx] = order_hint;
  }

  int ref_stamp = MFMV_STACK_SIZE - 1;

  if (ref_buf[LAST_FRAME - LAST_FRAME] != NULL) {
    const int alt_of_lst_order_hint =
        ref_buf[LAST_FRAME - LAST_FRAME]
            ->ref_order_hints[ALTREF_FRAME - LAST_FRAME];

    const int is_lst_overlay =
        (alt_of_lst_order_hint == ref_order_hint[GOLDEN_FRAME - LAST_FRAME]);
    if (!is_lst_overlay) motion_field_projection(cm, LAST_FRAME, 2);
    --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[BWDREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, BWDREF_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF2_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, ALTREF2_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0 &&
      ref_stamp >= 0)
    if (motion_field_projection(cm, ALTREF_FRAME, 0)) --ref_stamp;

  if (ref_stamp >= 0) motion_field_projection(cm, LAST2_FRAME, 2);
}